

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O0

XMLCh * xercesc_4_0::getBaseAttrValue(DOMNode *node)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  DOMAttr *pDVar5;
  long *plVar6;
  XMLCh *pXVar7;
  DOMAttr *pAttributeNode;
  XMLSize_t i;
  XMLSize_t nSize;
  DOMNamedNodeMap *pAttributes;
  DOMElement *elem;
  DOMNode *node_local;
  undefined4 extraout_var;
  
  iVar2 = (*node->_vptr_DOMNode[4])();
  if ((iVar2 == 1) && (uVar3 = (*node->_vptr_DOMNode[0x1a])(), (uVar3 & 1) != 0)) {
    iVar2 = (*node->_vptr_DOMNode[0xb])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    pDVar5 = (DOMAttr *)(**(code **)(*plVar4 + 0x28))();
    for (pAttributeNode = (DOMAttr *)0x0; pAttributeNode < pDVar5;
        pAttributeNode = (DOMAttr *)((long)&(pAttributeNode->super_DOMNode)._vptr_DOMNode + 1)) {
      plVar6 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,pAttributeNode);
      pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x140))();
      bVar1 = XMLString::equals(pXVar7,(XMLCh *)XIncludeUtils::fgXIBaseAttrName);
      if (bVar1) {
        pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x150))();
        return pXVar7;
      }
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

static const XMLCh *
getBaseAttrValue(DOMNode *node){
    if (node->getNodeType() == DOMNode::ELEMENT_NODE){
        DOMElement *elem = (DOMElement *)node;
        if(elem->hasAttributes()) {
            /* get all the attributes of the node */
            DOMNamedNodeMap *pAttributes = elem->getAttributes();
            XMLSize_t nSize = pAttributes->getLength();
            for(XMLSize_t i=0;i<nSize;++i) {
                DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                /* get attribute name */
                if (XMLString::equals(pAttributeNode->getName(), XIncludeUtils::fgXIBaseAttrName)){
                    /*if (namespace == XMLUni::fgXMLString){

                    }*/
                    return pAttributeNode->getValue();
                }
            }
        }
    }
    return NULL;
}